

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O1

void __thiscall
QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::
reject<std::__exception_ptr::exception_ptr>
          (PromiseDataBase<QString,_void_(const_QString_&)> *this,exception_ptr *error)

{
  void *pvVar1;
  void *pvVar2;
  void *__tmp;
  
  pvVar1 = error->_M_exception_object;
  if (pvVar1 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_addref();
  }
  pvVar2 = (this->m_error).m_data._M_exception_object;
  (this->m_error).m_data._M_exception_object = pvVar1;
  if (pvVar2 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  setSettled(this);
  return;
}

Assistant:

void reject(E&& error)
    {
        Q_ASSERT(isPending());
        Q_ASSERT(m_error.isNull());
        m_error = PromiseError{std::forward<E>(error)};
        setSettled();
    }